

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

string * tinyusdz::escapeBackslash
                   (string *__return_storage_ptr__,string *str,bool triple_quoted_string)

{
  ulong uVar1;
  pointer pcVar2;
  undefined7 in_register_00000011;
  string *s;
  ulong uVar3;
  string bs_escaped;
  string bs;
  allocator local_71;
  allocator local_70 [32];
  string local_50 [8];
  string *local_48;
  
  if ((int)CONCAT71(in_register_00000011,triple_quoted_string) == 0) {
    ::std::__cxx11::string::string(local_50,"\\",local_70);
    ::std::__cxx11::string::string((string *)local_70,"\\\\",&local_71);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
    while (uVar3 = ::std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_50),
          uVar3 != 0xffffffffffffffff) {
      ::std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,local_48);
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar3 = 0; uVar3 < str->_M_string_length; uVar3 = uVar3 + 1) {
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2[uVar3] == '\\') {
        uVar1 = uVar3 + 3;
        if (uVar1 < str->_M_string_length) {
          if (pcVar2[uVar3 + 1] == '\"') {
            if ((pcVar2[uVar3 + 2] != '\"') || (pcVar2[uVar1] != '\"')) goto LAB_0020e7d0;
          }
          else if ((pcVar2[uVar3 + 1] != '\'') ||
                  ((pcVar2[uVar3 + 2] != '\'' || (pcVar2[uVar1] != '\'')))) goto LAB_0020e7d0;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar3 = uVar1;
        }
        else {
LAB_0020e7d0:
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeBackslash(const std::string &str,
                            const bool triple_quoted_string) {
  if (triple_quoted_string) {
    std::string s;

    // Do not escape \""" or \'''

    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '\\') {
        if (i + 3 < str.size()) {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            s += "\\'''";
            i += 3;
          } else if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
                     (str[i + 3] == '"')) {
            s += "\\\"\"\"";
            i += 3;
          } else {
            s += "\\\\";
          }
        } else {
          s += "\\\\";
        }
      } else {
        s += str[i];
      }
    }

    return s;
  } else {
    const std::string bs = "\\";
    const std::string bs_escaped = "\\\\";

    std::string s = str;

    std::string::size_type pos = 0;
    while ((pos = s.find(bs, pos)) != std::string::npos) {
      s.replace(pos, bs.length(), bs_escaped);
      pos += bs_escaped.length();
    }

    return s;
  }
}